

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

void __thiscall ON_Extrusion::Dump(ON_Extrusion *this,ON_TextLog *text_log)

{
  ON_TextLog *pOVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint local_48;
  ON_3dPoint local_30;
  ON_TextLog *local_18;
  ON_TextLog *text_log_local;
  ON_Extrusion *this_local;
  
  local_18 = text_log;
  text_log_local = (ON_TextLog *)this;
  ON_TextLog::Print(text_log,"ON_Extrusion: \n");
  ON_TextLog::PushIndent(local_18);
  ON_TextLog::Print(local_18,"Path: ");
  pOVar1 = local_18;
  dVar2 = ON_Interval::operator[](&this->m_t,0);
  ON_Line::PointAt(&local_30,&this->m_path,dVar2);
  ON_TextLog::Print(pOVar1,&local_30);
  ON_TextLog::Print(local_18," ");
  pOVar1 = local_18;
  dVar2 = ON_Interval::operator[](&this->m_t,1);
  ON_Line::PointAt(&local_48,&this->m_path,dVar2);
  ON_TextLog::Print(pOVar1,&local_48);
  ON_TextLog::Print(local_18,"\n");
  ON_TextLog::Print(local_18,"Up: ");
  ON_TextLog::Print(local_18,&this->m_up);
  ON_TextLog::Print(local_18,"\n");
  ON_TextLog::Print(local_18,"m_bCap[] = (%d, %d)\n",(ulong)(this->m_bCap[0] & 1),
                    (ulong)(this->m_bCap[1] & 1));
  ON_TextLog::Print(local_18,"m_bHaveN[] = (%d, %d)\n",(ulong)(this->m_bHaveN[0] & 1),
                    (ulong)(this->m_bHaveN[1] & 1));
  ON_TextLog::Print(local_18,"m_N[] = (");
  ON_TextLog::Print(local_18,this->m_N);
  ON_TextLog::Print(local_18,", ");
  ON_TextLog::Print(local_18,this->m_N + 1);
  ON_TextLog::Print(local_18,"\n");
  pOVar1 = local_18;
  dVar2 = ON_Interval::operator[](&this->m_path_domain,0);
  dVar3 = ON_Interval::operator[](&this->m_path_domain,1);
  ON_TextLog::Print(pOVar1,"m_path_domain = (%.17g, %.17g)\n",dVar2,SUB84(dVar3,0));
  ON_TextLog::Print(local_18,"m_bTransposed = %d\n",(ulong)(this->m_bTransposed & 1));
  ON_TextLog::Print(local_18,"Profile Count: %d\n",(ulong)(uint)this->m_profile_count);
  ON_TextLog::Print(local_18,"Profile:\n");
  ON_TextLog::PushIndent(local_18);
  if (this->m_profile == (ON_Curve *)0x0) {
    ON_TextLog::Print(local_18,"nullptr");
  }
  else {
    (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[7])
              (this->m_profile,local_18);
  }
  ON_TextLog::PopIndent(local_18);
  ON_MeshCache::Dump(&this->m_mesh_cache,local_18);
  ON_TextLog::PopIndent(local_18);
  return;
}

Assistant:

void ON_Extrusion::Dump( ON_TextLog& text_log ) const
{
  text_log.Print("ON_Extrusion: \n");
  {
    text_log.PushIndent();
    text_log.Print("Path: ");
    text_log.Print(m_path.PointAt(m_t[0]));
    text_log.Print(" ");
    text_log.Print(m_path.PointAt(m_t[1]));
    text_log.Print("\n");
    text_log.Print("Up: ");
    text_log.Print(m_up);
    text_log.Print("\n");
    text_log.Print("m_bCap[] = (%d, %d)\n",m_bCap[0],m_bCap[1]);
    text_log.Print("m_bHaveN[] = (%d, %d)\n",m_bHaveN[0],m_bHaveN[1]);
    text_log.Print("m_N[] = (");
    text_log.Print(m_N[0]);
    text_log.Print(", ");
    text_log.Print(m_N[1]);
    text_log.Print("\n");
    text_log.Print("m_path_domain = (%.17g, %.17g)\n",m_path_domain[0],m_path_domain[1]);
    text_log.Print("m_bTransposed = %d\n",m_bTransposed);
    text_log.Print("Profile Count: %d\n",m_profile_count);
    text_log.Print("Profile:\n");
    {
      text_log.PushIndent();
      if ( !m_profile )
        text_log.Print("nullptr");
      else
        m_profile->Dump(text_log);
      text_log.PopIndent();
    }

    m_mesh_cache.Dump(text_log);

    text_log.PopIndent();
  }

  return;
}